

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.cpp
# Opt level: O0

void __thiscall
TasOptimization::ParticleSwarmState::ParticleSwarmState
          (ParticleSwarmState *this,int cnum_dimensions,int cnum_particles)

{
  int iVar1;
  int iVar2;
  allocator<bool> local_4d;
  bool local_4c;
  allocator<bool> local_4b;
  bool local_4a;
  allocator<double> local_49;
  double local_48;
  allocator<double> local_39;
  double local_38;
  allocator<double> local_2e;
  allocator<double> local_2d [20];
  allocator<double> local_19;
  int local_18;
  int local_14;
  int cnum_particles_local;
  int cnum_dimensions_local;
  ParticleSwarmState *this_local;
  
  this->positions_initialized = false;
  this->velocities_initialized = false;
  this->best_positions_initialized = false;
  this->cache_initialized = false;
  this->num_dimensions = cnum_dimensions;
  this->num_particles = cnum_particles;
  iVar1 = this->num_dimensions;
  iVar2 = this->num_particles;
  local_18 = cnum_particles;
  local_14 = cnum_dimensions;
  _cnum_particles_local = this;
  std::allocator<double>::allocator(&local_19);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->particle_positions,(long)(iVar2 * iVar1),&local_19);
  std::allocator<double>::~allocator(&local_19);
  iVar1 = this->num_dimensions;
  iVar2 = this->num_particles;
  std::allocator<double>::allocator(local_2d);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->particle_velocities,(long)(iVar2 * iVar1),local_2d);
  std::allocator<double>::~allocator(local_2d);
  iVar1 = this->num_dimensions;
  iVar2 = this->num_particles;
  std::allocator<double>::allocator(&local_2e);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->best_particle_positions,(long)((iVar2 + 1) * iVar1),&local_2e);
  std::allocator<double>::~allocator(&local_2e);
  iVar1 = this->num_particles;
  local_38 = std::numeric_limits<double>::max();
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_particle_fvals,(long)iVar1,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  iVar1 = this->num_particles;
  local_48 = std::numeric_limits<double>::max();
  std::allocator<double>::allocator(&local_49);
  std::vector<double,_std::allocator<double>_>::vector
            (&this->cache_best_particle_fvals,(long)(iVar1 + 1),&local_48,&local_49);
  std::allocator<double>::~allocator(&local_49);
  iVar1 = this->num_particles;
  local_4a = false;
  std::allocator<bool>::allocator(&local_4b);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_particle_inside,(long)iVar1,&local_4a,&local_4b);
  std::allocator<bool>::~allocator(&local_4b);
  iVar1 = this->num_particles;
  local_4c = false;
  std::allocator<bool>::allocator(&local_4d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->cache_best_particle_inside,(long)(iVar1 + 1),&local_4c,&local_4d);
  std::allocator<bool>::~allocator(&local_4d);
  return;
}

Assistant:

ParticleSwarmState::ParticleSwarmState(int cnum_dimensions, int cnum_particles):
        positions_initialized(false), velocities_initialized(false), best_positions_initialized(false), cache_initialized(false),
        num_dimensions(cnum_dimensions), num_particles(cnum_particles),
        particle_positions(std::vector<double>(num_particles * num_dimensions)),
        particle_velocities(std::vector<double>(num_particles * num_dimensions)),
        best_particle_positions(std::vector<double>((num_particles + 1) * num_dimensions)),
        cache_particle_fvals(std::vector<double>(num_particles, std::numeric_limits<double>::max())),
        cache_best_particle_fvals(std::vector<double>(num_particles + 1, std::numeric_limits<double>::max())),
        cache_particle_inside(std::vector<bool>(num_particles, false)),
        cache_best_particle_inside(std::vector<bool>(num_particles + 1, false)) {}